

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

char * signalForMember(char *member)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  int i;
  QByteArray normalizedMember;
  int local_34;
  char *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedSignature((char *)&local_20);
  local_34 = 0;
  do {
    if (2 < local_34) {
      local_28 = "2accepted()";
LAB_0079d32f:
      QByteArray::~QByteArray((QByteArray *)0x79d339);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_28;
      }
      __stack_chk_fail();
    }
    pcVar1 = candidateSignal(local_34);
    pcVar2 = QByteArray::operator_cast_to_char_((QByteArray *)0x79d2e1);
    uVar3 = QMetaObject::checkConnectArgs(pcVar1,pcVar2);
    if ((uVar3 & 1) != 0) {
      local_28 = candidateSignal(local_34);
      goto LAB_0079d32f;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static const char *signalForMember(const char *member)
{
    QByteArray normalizedMember(QMetaObject::normalizedSignature(member));

    for (int i = 0; i < NumCandidateSignals; ++i)
        if (QMetaObject::checkConnectArgs(candidateSignal(i), normalizedMember))
            return candidateSignal(i);

    // otherwise, use fit-all accepted signal:
    return SIGNAL(accepted());
}